

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O1

variable_order_t * __thiscall
merlin::graphical_model::order2
          (variable_order_t *__return_storage_ptr__,graphical_model *this,OrderMethod ord_type,
          vector<bool,_std::allocator<bool>_> *var_types)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  unsigned_long uVar3;
  pointer pmVar4;
  vector<bool,_std::allocator<bool>_> *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pointer puVar9;
  index *piVar10;
  _Base_ptr p_Var11;
  _Rb_tree_node_base *p_Var12;
  _Rb_tree_node_base *p_Var13;
  pointer peVar14;
  ulong uVar15;
  const_iterator ci;
  pointer pvVar16;
  size_type sVar17;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_00;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *p_Var18;
  long lVar19;
  size_t sVar20;
  _Rb_tree_header *p_Var21;
  index *piVar22;
  iterator si;
  bool bVar23;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar24;
  size_t cand;
  vector<unsigned_long,_std::allocator<unsigned_long>_> candidates;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> neighbors;
  my_set<merlin::edge_id> nlist;
  vector<unsigned_long,_std::allocator<unsigned_long>_> simplicial;
  vector<int,_std::allocator<int>_> scores;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> to_fix;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> sum_vars;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> map_vars;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> adj;
  graph G;
  unsigned_long local_280;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_278;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_258;
  OrderMethod local_24c;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_248;
  size_type local_218;
  vector<bool,_std::allocator<bool>_> *local_210;
  my_set<merlin::edge_id> local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e8;
  vector<int,_std::allocator<int>_> local_1d0;
  graphical_model *local_1b8;
  unsigned_long local_1b0;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_1a8;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_178;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_148;
  vector<merlin::variable_set,_std::allocator<merlin::variable_set>_> local_118;
  undefined1 local_100 [96];
  unsigned_long *local_a0;
  _Elt_pointer local_90;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258 = (vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__;
  local_24c.t_ = ord_type.t_;
  graph::graph((graph *)local_100,
               (long)(this->m_vadj).
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_vadj).
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
  mrf(&local_118,this);
  local_210 = var_types;
  if ((this->m_vadj).
      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->m_vadj).
      super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar17 = 0;
  }
  else {
    uVar15 = 0;
    do {
      puVar9 = local_118.
               super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar15].m_v.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_118.super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15].m_v.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar9) {
        pvVar16 = local_118.
                  super__Vector_base<merlin::variable_set,_std::allocator<merlin::variable_set>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar15;
        lVar19 = 0;
        do {
          graph::add_edge((graph *)local_100,uVar15,puVar9[lVar19]);
          lVar19 = lVar19 + 1;
          puVar9 = (pvVar16->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (lVar19 != (long)(pvVar16->m_v).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 3);
      }
      uVar15 = uVar15 + 1;
      sVar17 = (long)(this->m_vadj).
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_vadj).
                     super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
    } while (uVar15 < sVar17);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_258,sVar17);
  local_178._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_178._M_impl.super__Rb_tree_header._M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_148._M_impl.super__Rb_tree_header._M_header;
  local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_248._M_impl._0_8_ = (index *)0x0;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right =
       local_178._M_impl.super__Rb_tree_header._M_header._M_left;
  local_148._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148._M_impl.super__Rb_tree_header._M_header._M_left;
  if (sVar17 != 0) {
    do {
      piVar10 = (index *)(local_248._M_impl._0_8_ + 0x3f);
      if (-1 < (long)local_248._M_impl._0_8_) {
        piVar10 = (index *)local_248._M_impl._0_8_;
      }
      this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                 *)&local_178;
      if (((local_210->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)piVar10 >> 6) +
            (ulong)((local_248._M_impl._0_8_ & 0x800000000000003f) < 0x8000000000000001) +
            0xffffffffffffffff] >> (local_248._M_impl._0_8_ & 0x3f) & 1) != 0) {
        this_00 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                   *)&local_148;
      }
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>(this_00,(unsigned_long *)&local_248);
      local_248._M_impl._0_8_ = local_248._M_impl._0_8_ + 1;
    } while ((ulong)local_248._M_impl._0_8_ < sVar17);
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0,sVar17,(allocator_type *)&local_248);
  if (sVar17 != 0) {
    sVar20 = 0;
    do {
      iVar6 = order_score(this,(graph *)local_100,sVar20,local_24c);
      local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar20] = iVar6;
      sVar20 = sVar20 + 1;
    } while (sVar17 != sVar20);
  }
  local_1b8 = this;
  p_Var1 = &local_248._M_impl.super__Rb_tree_header;
  do {
    if ((int)sVar17 == 0) break;
    local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (unsigned_long *)0x0;
    local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    p_Var18 = &local_178;
    if (local_178._M_impl.super__Rb_tree_header._M_node_count == 0) {
      p_Var18 = &local_148;
    }
    p_Var11 = (p_Var18->_M_impl).super__Rb_tree_header._M_header._M_left;
    p_Var18 = &local_178;
    if (local_178._M_impl.super__Rb_tree_header._M_node_count == 0) {
      p_Var18 = &local_148;
    }
    p_Var21 = &(p_Var18->_M_impl).super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 == p_Var21) {
      bVar23 = true;
    }
    else {
      iVar6 = 0x7fffffff;
      local_218 = sVar17;
      do {
        piVar10 = (index *)(long)(int)p_Var11[1]._M_color;
        iVar7 = local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar10];
        if (iVar7 == 0) {
          if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_248._M_impl._0_8_ = piVar10;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_1e8,
                       (iterator)
                       local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_248);
          }
          else {
            *local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)piVar10;
            local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
            local_248._M_impl._0_8_ = piVar10;
          }
        }
        else if (iVar7 < iVar6) {
          if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
          }
          iVar6 = iVar7;
          if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_248._M_impl._0_8_ = piVar10;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_278,
                       (iterator)
                       local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_248);
          }
          else {
            *local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)piVar10;
            local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
            local_248._M_impl._0_8_ = piVar10;
          }
        }
        else if (iVar7 == iVar6) {
          if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_248._M_impl._0_8_ = piVar10;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_278,
                       (iterator)
                       local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_248);
          }
          else {
            *local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)piVar10;
            local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
            local_248._M_impl._0_8_ = piVar10;
          }
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var21);
      bVar23 = iVar6 == 0x7fffffff;
      sVar17 = local_218;
    }
    pvVar5 = local_210;
    puVar9 = local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        local_208.super_my_vector<merlin::edge_id>.
        super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
        super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*puVar9;
        iVar2._M_current = *(unsigned_long **)(local_258 + 8);
        if (iVar2._M_current == *(unsigned_long **)(local_258 + 0x10)) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(local_258,iVar2,(unsigned_long *)&local_208);
        }
        else {
          *iVar2._M_current =
               (unsigned_long)
               local_208.super_my_vector<merlin::edge_id>.
               super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
               super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(unsigned_long **)(local_258 + 8) = iVar2._M_current + 1;
        }
        my_set<merlin::edge_id>::my_set
                  ((my_set<merlin::edge_id> *)&local_248,
                   (my_set<merlin::edge_id> *)
                   (local_100._0_8_ +
                   local_208.super_my_vector<merlin::edge_id>.
                   super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                   super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                   super__Vector_impl_data._M_start * 0x20));
        for (piVar10 = (index *)local_248._M_impl._0_8_;
            piVar10 !=
            (index *)CONCAT44(local_248._M_impl.super__Rb_tree_header._M_header._4_4_,
                              local_248._M_impl.super__Rb_tree_header._M_header._M_color);
            piVar10 = piVar10 + 4) {
          graph::remove_edge((graph *)local_100,*piVar10,piVar10[1]);
        }
        local_1a8._M_impl._0_8_ =
             local_208.super_my_vector<merlin::edge_id>.
             super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
             super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
             super__Vector_impl_data._M_start;
        if (local_a0 == local_90 + -1) {
          std::deque<unsigned_long,std::allocator<unsigned_long>>::
          _M_push_back_aux<unsigned_long_const&>
                    ((deque<unsigned_long,std::allocator<unsigned_long>> *)(local_100 + 0x30),
                     (unsigned_long *)&local_1a8);
        }
        else {
          *local_a0 = (unsigned_long)
                      local_208.super_my_vector<merlin::edge_id>.
                      super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                      super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_a0 = local_a0 + 1;
        }
        local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(long)local_208.super_my_vector<merlin::edge_id>.
                       super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                       super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl
                       .super__Vector_impl_data._M_start] = 0x7fffffff;
        peVar14 = (pointer)((long)&local_208.super_my_vector<merlin::edge_id>.
                                   super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                                   super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].ridx + 7);
        if (-1 < (long)local_208.super_my_vector<merlin::edge_id>.
                       super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                       super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl
                       .super__Vector_impl_data._M_start) {
          peVar14 = local_208.super_my_vector<merlin::edge_id>.
                    super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                    super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
        if (((pvVar5->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)peVar14 >> 6) +
              (ulong)(((ulong)local_208.super_my_vector<merlin::edge_id>.
                              super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                              super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0x800000000000003f) <
                     0x8000000000000001) + 0xffffffffffffffff] >>
             ((ulong)local_208.super_my_vector<merlin::edge_id>.
                     super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                     super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                     super__Vector_impl_data._M_start & 0x3f) & 1) == 0) {
          pVar24 = std::
                   _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   ::equal_range(&local_178,(key_type *)&local_208);
          p_Var18 = &local_178;
        }
        else {
          pVar24 = std::
                   _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   ::equal_range(&local_148,(key_type *)&local_208);
          p_Var18 = &local_148;
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_M_erase_aux(p_Var18,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
        if ((index *)local_248._M_impl._0_8_ != (index *)0x0) {
          operator_delete((void *)local_248._M_impl._0_8_);
        }
        sVar17 = (size_type)((int)sVar17 - 1);
        puVar9 = puVar9 + 1;
      } while (puVar9 != local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (!bVar23) {
      iVar6 = (int)((ulong)((long)local_278.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_278.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar6 < 1) {
        __assert_fail("imax > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/util.h"
                      ,0x91,"int merlin::randi2(int)");
      }
      iVar7 = rand();
      iVar8 = (int)((double)iVar6 * ((double)iVar7 / 2147483647.0));
      iVar7 = iVar6 + -1;
      if (iVar8 < iVar6) {
        iVar7 = iVar8;
      }
      local_280 = local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[iVar7];
      iVar2._M_current = *(unsigned_long **)(local_258 + 8);
      if (iVar2._M_current == *(unsigned_long **)(local_258 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(local_258,iVar2,&local_280);
      }
      else {
        *iVar2._M_current = local_280;
        *(unsigned_long **)(local_258 + 8) = iVar2._M_current + 1;
      }
      my_set<merlin::edge_id>::my_set
                (&local_208,(my_set<merlin::edge_id> *)(local_100._0_8_ + local_280 * 0x20));
      local_248._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_248._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var13 = &p_Var1->_M_header;
      local_248._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_248._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      if (local_208.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_208.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        piVar22 = &(local_208.super_my_vector<merlin::edge_id>.
                    super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                    super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                    super__Vector_impl_data._M_start)->second;
        do {
          if ((((edge_id *)(piVar22 + -1))->first == local_280) && (*piVar22 != local_280)) {
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)&local_248,piVar22);
          }
          peVar14 = (pointer)(piVar22 + 3);
          piVar22 = piVar22 + 4;
          p_Var13 = local_248._M_impl.super__Rb_tree_header._M_header._M_left;
        } while (peVar14 !=
                 local_208.super_my_vector<merlin::edge_id>.
                 super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                 super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      for (; p_Var12 = p_Var13, (_Rb_tree_header *)p_Var13 != p_Var1;
          p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
        while (p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12),
              (_Rb_tree_header *)p_Var12 != p_Var1) {
          graph::add_edge((graph *)local_100,*(index *)(p_Var13 + 1),*(index *)(p_Var12 + 1));
        }
      }
      local_218 = sVar17;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_Rb_tree(&local_1a8,&local_248);
      p_Var13 = local_248._M_impl.super__Rb_tree_header._M_header._M_left;
      pmVar4 = (pointer)local_100._0_8_;
      while (local_100._0_8_ = pmVar4, (_Rb_tree_header *)p_Var13 != p_Var1) {
        uVar3 = *(unsigned_long *)(p_Var13 + 1);
        peVar14 = pmVar4[uVar3].super_my_vector<merlin::edge_id>.
                  super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                  super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (peVar14 !=
            pmVar4[uVar3].super_my_vector<merlin::edge_id>.
            super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
            super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          piVar22 = &peVar14->second;
          do {
            if ((((edge_id *)(piVar22 + -1))->first == uVar3) && (uVar3 != *piVar22)) {
              std::
              _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              ::_M_insert_unique<unsigned_long_const&>
                        ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&local_1a8,piVar22);
            }
            peVar14 = (pointer)(piVar22 + 3);
            piVar22 = piVar22 + 4;
          } while (peVar14 !=
                   pmVar4[uVar3].super_my_vector<merlin::edge_id>.
                   super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                   super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
        pmVar4 = (pointer)local_100._0_8_;
      }
      pVar24 = std::
               _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               ::equal_range(&local_1a8,&local_280);
      pvVar5 = local_210;
      sVar17 = local_218;
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux(&local_1a8,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
      for (peVar14 = local_208.super_my_vector<merlin::edge_id>.
                     super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                     super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
                     super__Vector_impl_data._M_start;
          peVar14 !=
          local_208.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_finish; peVar14 = peVar14 + 1) {
        graph::remove_edge((graph *)local_100,peVar14->first,peVar14->second);
      }
      local_1b0 = local_280;
      if (local_a0 == local_90 + -1) {
        std::deque<unsigned_long,std::allocator<unsigned_long>>::
        _M_push_back_aux<unsigned_long_const&>
                  ((deque<unsigned_long,std::allocator<unsigned_long>> *)(local_100 + 0x30),
                   &local_1b0);
      }
      else {
        *local_a0 = local_280;
        local_a0 = local_a0 + 1;
      }
      local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[local_280] = 0x7fffffff;
      uVar15 = local_280 + 0x3f;
      if (-1 < (long)local_280) {
        uVar15 = local_280;
      }
      if (((pvVar5->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar15 >> 6) +
            (ulong)((local_280 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (local_280 & 0x3f) & 1) == 0) {
        pVar24 = std::
                 _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::equal_range(&local_178,&local_280);
        p_Var18 = &local_178;
      }
      else {
        pVar24 = std::
                 _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::equal_range(&local_148,&local_280);
        p_Var18 = &local_148;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::_M_erase_aux(p_Var18,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
      for (p_Var11 = local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var11 != &local_1a8._M_impl.super__Rb_tree_header;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        sVar20 = *(size_t *)(p_Var11 + 1);
        iVar6 = order_score(local_1b8,(graph *)local_100,sVar20,local_24c);
        local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar20] = iVar6;
      }
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_1a8);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree(&local_248);
      if (local_208.super_my_vector<merlin::edge_id>.
          super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
          super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_208.super_my_vector<merlin::edge_id>.
                        super_vector<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                        super__Vector_base<merlin::edge_id,_std::allocator<merlin::edge_id>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      sVar17 = (size_type)((int)sVar17 - 1);
    }
    if (local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_1e8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
      operator_delete(local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  } while (!bVar23);
  if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_148);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&local_178);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&local_118);
  graph::~graph((graph *)local_100);
  return (variable_order_t *)local_258;
}

Assistant:

variable_order_t order2(OrderMethod ord_type, std::vector<bool> var_types) const {

		// variable order to be computed
		variable_order_t order;

		// create a temporary graph
		graph G(nvar());
		std::vector<variable_set> adj = mrf();
		for (size_t i = 0; i < nvar(); ++i) {
			variable_set& vs = adj[i];
			for (variable_set::const_iterator vi = vs.begin();
					vi != vs.end(); ++vi) {
				size_t j = _vindex(*vi);
				G.add_edge(i, j);
			}
		}

		// reserve space for the order
		size_t n = nvar();
		order.reserve(n);

		// identify SUM and MAP variables
		std::set<size_t> sum_vars, map_vars;
		for (size_t i = 0; i < n; ++i) {
			if (var_types[i] == false) sum_vars.insert(i);
			else map_vars.insert(i);
		}

		// keeps track of node scores
		std::vector<int> scores(n);
		for (size_t i = 0; i < n; ++i) {
			scores[i] = order_score(G, i, ord_type);
		}

		// eliminate nodes until all gone
		int min_score = -1, num_nodes = n;
		size_t width = 0;
		while (num_nodes != 0) {

			// keeps track of minimal score nodes
			std::vector<size_t> candidates; // minimal score of 1 or higher
			std::vector<size_t> simplicial; // simplicial nodes (score 0)

			min_score = std::numeric_limits<int>::max();

			// check if there are SUM vars left to eliminate
			std::set<size_t>::iterator start, stop;
			if (sum_vars.empty() == false) { // yes
				start = sum_vars.begin();
				stop = sum_vars.end();
			} else { // done, move to MAP vars
				start = map_vars.begin();
				stop = map_vars.end();
			}
			for (std::set<size_t>::iterator si = start; si != stop; ++si) {
				int v = *si;
				if (scores[v] == 0) { // score 0
					simplicial.push_back(v);
				} else if (scores[v] < min_score) { // new, lower score (but greater 0)
					min_score = scores[v];
					candidates.clear();
					candidates.push_back(v);
				} else if (scores[v] == min_score) { // current min. found again
					candidates.push_back(v);
				}
			}

			// eliminate all nodes with score=0 -> no edges will have to be added
			for (std::vector<size_t>::iterator it = simplicial.begin();
					it != simplicial.end(); ++it) {
				size_t v = (*it);
				order.push_back(v);
				--num_nodes;
				my_set<edge_id> temp = G.neighbors(v);
				width = std::max(width, temp.size());
				for (my_set<edge_id>::const_iterator ci = temp.begin();
						ci != temp.end(); ++ci) {
					size_t i = ci->first, j = ci->second;
					G.remove_edge(i, j);
				}
				G.remove_node(v); // and adj edges
				scores[v] = std::numeric_limits<int>::max();
				if (var_types[v] == false) sum_vars.erase(v);
				else map_vars.erase(v);
			}

			// anything left to eliminate? If not, we are done!
			if (min_score == std::numeric_limits<int>::max()) {
				break;
			}

			// Pick one of the minimal score nodes (with score >= 1),
			// breaking ties randomly
			size_t cand = candidates[randi2(candidates.size())];
			//size_t cand = candidates[0]; // first candidate in list (lexicograhically)
			order.push_back(cand);
			--num_nodes;

			// remember it's neighbors, to be used later
			my_set<edge_id> nlist = G.neighbors(cand);
			std::set<size_t> neighbors;
			for (my_set<edge_id>::const_iterator ci = nlist.begin();
					ci != nlist.end(); ++ci) {
				if (ci->first == cand && ci->second != cand)
					neighbors.insert(ci->second);
			}

			// connect neighbors in primal graph
			std::set<size_t>::iterator it1, it2;
			for (it1 = neighbors.begin(); it1 != neighbors.end(); ++it1) {
				it2 = it1;
				while (++it2 != neighbors.end()) {
					size_t i = *it1, j = *it2;
					G.add_edge(i, j);
				}
			}

			// compute candidates for score update (node's neighbors and their neighbors)
			width = std::max(width, neighbors.size());
			std::set<size_t> to_fix(neighbors);
			for (std::set<size_t>::const_iterator it = neighbors.begin();
					it != neighbors.end(); ++it) {
				size_t v = (*it);
				const my_set<edge_id>& temp = G.neighbors(v);
				for (my_set<edge_id>::const_iterator ci = temp.begin();
						ci != temp.end(); ++ci) {
					if (ci->first == v && v != ci->second)
						to_fix.insert(ci->second);
				}
			}
			to_fix.erase(cand);

			// remove node from primal graph
			for (my_set<edge_id>::const_iterator ci = nlist.begin();
					ci != nlist.end(); ++ci) {
				size_t i = ci->first, j = ci->second;
				G.remove_edge(i, j);
			}
			G.remove_node(cand); // and adj edges
			scores[cand] = std::numeric_limits<int>::max(); // tag score
			if (var_types[cand] == false) sum_vars.erase(cand);
			else map_vars.erase(cand);

			// update scores in primal graph (candidate nodes computed earlier)
			for (std::set<size_t>::const_iterator it = to_fix.begin();
					it != to_fix.end(); ++it) {
				size_t v = (*it);
				scores[v] = order_score(G, v, ord_type);
			}
		}

		return order;
	}